

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O0

bool __thiscall OpenMD::FragmentStamp::addBendStamp(FragmentStamp *this,BendStamp *bend)

{
  value_type *in_RDI;
  vector<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_> *unaff_retaddr;
  
  std::vector<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>::push_back
            (unaff_retaddr,in_RDI);
  return true;
}

Assistant:

bool FragmentStamp::addBendStamp(BendStamp* bend) {
    bendStamps_.push_back(bend);
    return true;
  }